

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void update_object_subwindow(game_event_type type,game_event_data *data,void *user)

{
  object *obj;
  object_kind *kind;
  term *t;
  
  t = Term;
  Term_activate((term *)user);
  obj = player->upkeep->object;
  if (obj == (object *)0x0) {
    kind = player->upkeep->object_kind;
    if (kind != (object_kind *)0x0) {
      display_object_kind_recall(kind);
    }
  }
  else {
    display_object_recall(obj);
  }
  Term_fresh();
  Term_activate(t);
  return;
}

Assistant:

static void update_object_subwindow(game_event_type type,
									game_event_data *data, void *user)
{
	term *old = Term;
	term *inv_term = user;
	
	/* Activate */
	Term_activate(inv_term);
	
	if (player->upkeep->object != NULL)
		display_object_recall(player->upkeep->object);
	else if (player->upkeep->object_kind)
		display_object_kind_recall(player->upkeep->object_kind);
	Term_fresh();
	
	/* Restore */
	Term_activate(old);
}